

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenMutateArray_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this)

{
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  SwiftGenerator *local_18;
  SwiftGenerator *this_local;
  
  local_18 = this;
  this_local = (SwiftGenerator *)__return_storage_ptr__;
  GenOffset_abi_cxx11_(&local_58,this);
  std::operator+(&local_38,
                 "{{ACCESS_TYPE}} func mutate({{FIELDVAR}}: {{VALUETYPE}}, at index: Int32) -> Bool { "
                 ,&local_58);
  std::operator+(__return_storage_ptr__,&local_38,
                 "return {{ACCESS}}.directMutate({{FIELDVAR}}, index: {{ACCESS}}.vector(at: o) + index * {{SIZE}}) }"
                );
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string GenMutateArray() {
    return "{{ACCESS_TYPE}} func mutate({{FIELDVAR}}: {{VALUETYPE}}, at "
           "index: Int32) -> Bool { " +
           GenOffset() +
           "return {{ACCESS}}.directMutate({{FIELDVAR}}, index: "
           "{{ACCESS}}.vector(at: o) + index * {{SIZE}}) }";
  }